

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

string * glcts::anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>(void)

{
  bool in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_30;
  
  glcts::(anonymous_namespace)::test_api::GL::glslVer_abi_cxx11_(&local_30,(GL *)0x0,in_DL);
  std::operator+(in_RDI,&local_30,
                 "\nin vec4 i_vertex;\nvoid main()\n{\n    gl_Position = i_vertex;\n}");
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string vshSimple()
{
	return api::glslVer() + NL "in vec4 i_vertex;" NL "void main()" NL "{" NL "    gl_Position = i_vertex;" NL "}";
}